

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzeArrayIndex(ExpressionContext *ctx,SynArrayIndex *syntax)

{
  Allocator *pAVar1;
  int iVar2;
  ArgumentData *pAVar3;
  ExprError *this;
  undefined4 extraout_var;
  TypeBase *pTVar4;
  undefined4 extraout_var_00;
  uint i;
  uint uVar5;
  SynCallArgument *pSVar6;
  ArrayView<ExprBase_*> arr;
  ArrayView<ExprBase_*> arr_00;
  ArrayView<ArgumentData> arguments_00;
  ExprBase *value;
  SmallArray<ExprBase_*,_8U> values;
  SmallArray<ArgumentData,_32U> arguments;
  
  value = AnalyzeExpression(ctx,syntax->value);
  SmallArray<ArgumentData,_32U>::SmallArray(&arguments,ctx->allocator);
  pSVar6 = (syntax->arguments).head;
  while (pSVar6 != (SynCallArgument *)0x0) {
    values.little[2] = AnalyzeExpression(ctx,pSVar6->value);
    values.little[0] = (ExprBase *)pSVar6->name;
    values.data = (ExprBase **)values.little[2]->source;
    values.little[1] = (ExprBase *)values.little[2]->type;
    values.count = values.count & 0xffffff00;
    values.little[3] = (ExprBase *)0x0;
    SmallArray<ArgumentData,_32U>::push_back(&arguments,(ArgumentData *)&values);
    pSVar6 = (SynCallArgument *)(pSVar6->super_SynBase).next;
    if ((pSVar6 == (SynCallArgument *)0x0) || ((pSVar6->super_SynBase).typeID != 0x18)) {
      pSVar6 = (SynCallArgument *)0x0;
    }
  }
  if ((value->type == (TypeBase *)0x0) || (value->type->typeID != 0)) {
    for (uVar5 = 0; uVar5 < arguments.count; uVar5 = uVar5 + 1) {
      pAVar3 = SmallArray<ArgumentData,_32U>::operator[](&arguments,uVar5);
      pTVar4 = pAVar3->value->type;
      if ((pTVar4 != (TypeBase *)0x0) && (pTVar4->typeID == 0)) {
        values.allocator = ctx->allocator;
        values.data = values.little;
        values.count = 0;
        values.max = 8;
        SmallArray<ExprBase_*,_8U>::push_back(&values,&value);
        for (uVar5 = 0; uVar5 < arguments.count; uVar5 = uVar5 + 1) {
          pAVar3 = SmallArray<ArgumentData,_32U>::operator[](&arguments,uVar5);
          SmallArray<ExprBase_*,_8U>::push_back(&values,&pAVar3->value);
        }
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
        this = (ExprError *)CONCAT44(extraout_var,iVar2);
        pAVar1 = ctx->allocator;
        pTVar4 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        arr.count = values.count;
        arr.data = values.data;
        arr._12_4_ = 0;
        ExprError::ExprError(this,pAVar1,&syntax->super_SynBase,pTVar4,arr);
        goto LAB_001d01e6;
      }
    }
    arguments_00.count = arguments.count;
    arguments_00.data = arguments.data;
    arguments_00._12_4_ = 0;
    this = (ExprError *)CreateArrayIndex(ctx,&syntax->super_SynBase,value,arguments_00);
  }
  else {
    values.allocator = ctx->allocator;
    values.data = values.little;
    values.count = 0;
    values.max = 8;
    SmallArray<ExprBase_*,_8U>::push_back(&values,&value);
    for (uVar5 = 0; uVar5 < arguments.count; uVar5 = uVar5 + 1) {
      pAVar3 = SmallArray<ArgumentData,_32U>::operator[](&arguments,uVar5);
      SmallArray<ExprBase_*,_8U>::push_back(&values,&pAVar3->value);
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    this = (ExprError *)CONCAT44(extraout_var_00,iVar2);
    pAVar1 = ctx->allocator;
    pTVar4 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    arr_00.count = values.count;
    arr_00.data = values.data;
    arr_00._12_4_ = 0;
    ExprError::ExprError(this,pAVar1,&syntax->super_SynBase,pTVar4,arr_00);
LAB_001d01e6:
    SmallArray<ExprBase_*,_8U>::~SmallArray(&values);
  }
  SmallArray<ArgumentData,_32U>::~SmallArray(&arguments);
  return &this->super_ExprBase;
}

Assistant:

ExprBase* AnalyzeArrayIndex(ExpressionContext &ctx, SynArrayIndex *syntax)
{
	ExprBase *value = AnalyzeExpression(ctx, syntax->value);

	SmallArray<ArgumentData, 32> arguments(ctx.allocator);

	for(SynCallArgument *curr = syntax->arguments.head; curr; curr = getType<SynCallArgument>(curr->next))
	{
		ExprBase *index = AnalyzeExpression(ctx, curr->value);

		arguments.push_back(ArgumentData(index->source, false, curr->name, index->type, index));
	}

	if(isType<TypeError>(value->type))
	{
		SmallArray<ExprBase*, 8> values(ctx.allocator);

		values.push_back(value);

		for(unsigned i = 0; i < arguments.size(); i++)
			values.push_back(arguments[i].value);

		return new (ctx.get<ExprError>()) ExprError(ctx.allocator, syntax, ctx.GetErrorType(), values);
	}

	for(unsigned i = 0; i < arguments.size(); i++)
	{
		if(isType<TypeError>(arguments[i].value->type))
		{
			SmallArray<ExprBase*, 8> values(ctx.allocator);

			values.push_back(value);

			for(unsigned i = 0; i < arguments.size(); i++)
				values.push_back(arguments[i].value);

			return new (ctx.get<ExprError>()) ExprError(ctx.allocator, syntax, ctx.GetErrorType(), values);
		}
	}

	return CreateArrayIndex(ctx, syntax, value, arguments);
}